

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O1

EStatusCode __thiscall
ShadingWriter::WriteShadingType1Object
          (ShadingWriter *this,PDFRectangle *inBounds,ObjectIDType inShadingObjectId,
          ObjectIDType *outFunctionObjectId)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EStatusCode EVar2;
  IndirectObjectsReferenceRegistry *this_00;
  ObjectIDType inObjectReference;
  DictionaryContext *this_01;
  string local_50;
  
  this_00 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
  inObjectReference = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_00);
  ObjectsContext::StartNewIndirectObject(this->mObjectsContext,inShadingObjectId);
  this_01 = ObjectsContext::StartDictionary(this->mObjectsContext);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ShadingType","");
  DictionaryContext::WriteKey(this_01,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  DictionaryContext::WriteIntegerValue(this_01,1);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Domain","");
  DictionaryContext::WriteKey(this_01,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  ObjectsContext::StartArray(this->mObjectsContext);
  ObjectsContext::WriteDouble(this->mObjectsContext,inBounds->LowerLeftX,eTokenSeparatorSpace);
  ObjectsContext::WriteDouble(this->mObjectsContext,inBounds->UpperRightX,eTokenSeparatorSpace);
  ObjectsContext::WriteDouble(this->mObjectsContext,inBounds->LowerLeftY,eTokenSeparatorSpace);
  ObjectsContext::WriteDouble(this->mObjectsContext,inBounds->UpperRightY,eTokenSeparatorSpace);
  ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorEndLine);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ColorSpace","");
  DictionaryContext::WriteKey(this_01,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"DeviceRGB","");
  DictionaryContext::WriteNameValue(this_01,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Function","");
  DictionaryContext::WriteKey(this_01,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  DictionaryContext::WriteNewObjectReferenceValue(this_01,inObjectReference);
  EVar2 = ObjectsContext::EndDictionary(this->mObjectsContext,this_01);
  if (EVar2 == eSuccess) {
    ObjectsContext::EndIndirectObject(this->mObjectsContext);
  }
  *outFunctionObjectId = inObjectReference;
  return EVar2;
}

Assistant:

PDFHummus::EStatusCode ShadingWriter::WriteShadingType1Object(const PDFRectangle& inBounds, ObjectIDType inShadingObjectId, ObjectIDType& outFunctionObjectId) {
    ObjectIDType functionObjectId = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();

    mObjectsContext->StartNewIndirectObject(inShadingObjectId);
    DictionaryContext* shadingDict = mObjectsContext->StartDictionary();
    shadingDict->WriteKey("ShadingType");
    shadingDict->WriteIntegerValue(1);
    shadingDict->WriteKey("Domain");
    mObjectsContext->StartArray();
    mObjectsContext->WriteDouble(inBounds.LowerLeftX);
    mObjectsContext->WriteDouble(inBounds.UpperRightX);
    mObjectsContext->WriteDouble(inBounds.LowerLeftY);
    mObjectsContext->WriteDouble(inBounds.UpperRightY);
    mObjectsContext->EndArray(eTokenSeparatorEndLine);    
    shadingDict->WriteKey("ColorSpace");
    shadingDict->WriteNameValue("DeviceRGB");
    shadingDict->WriteKey("Function");
    shadingDict->WriteNewObjectReferenceValue(functionObjectId);
    EStatusCode status = mObjectsContext->EndDictionary(shadingDict);
    if(eSuccess == status)
        mObjectsContext->EndIndirectObject();

    outFunctionObjectId = functionObjectId;

    return status;
}